

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t assertion_equal_int(char *file,wchar_t line,longlong v1,char *e1,longlong v2,char *e2,
                           void *extra)

{
  char *extra_00;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  if (v1 != v2) {
    failure_start(file,line,"%s != %s",e1,e2);
    logprintf("      %s=%lld (0x%llx, 0%llo)\n",e1,v1,v1,v1);
    extra_00 = "      %s=%lld (0x%llx, 0%llo)\n";
    logprintf("      %s=%lld (0x%llx, 0%llo)\n",e2,v2,v2,v2);
    failure_finish(extra_00);
  }
  return (uint)(v1 == v2);
}

Assistant:

int
assertion_equal_int(const char *file, int line,
    long long v1, const char *e1, long long v2, const char *e2, void *extra)
{
	assertion_count(file, line);
	if (v1 == v2)
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      %s=%lld (0x%llx, 0%llo)\n", e1, v1, v1, v1);
	logprintf("      %s=%lld (0x%llx, 0%llo)\n", e2, v2, v2, v2);
	failure_finish(extra);
	return (0);
}